

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::AutoReg::AutoReg
          (AutoReg *this,ITestInvoker *invoker,SourceLineInfo *lineInfo,StringRef *classOrMethod,
          NameAndTags *nameAndTags)

{
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar1;
  StringRef *classOrQualifiedMethodName;
  IMutableRegistryHub *pIVar2;
  string local_100;
  TestCase local_e0;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__AutoReg_001ad880;
  pSVar1 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  extractClassName_abi_cxx11_(&local_100,(Catch *)classOrMethod,classOrQualifiedMethodName);
  makeTestCase(&local_e0,invoker,&local_100,nameAndTags,lineInfo);
  pIVar2 = &(pSVar1->super_RegistryHub).super_IMutableRegistryHub;
  (*pIVar2->_vptr_IMutableRegistryHub[4])(pIVar2,&local_e0);
  TestCase::~TestCase(&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  return;
}

Assistant:

AutoReg::AutoReg( ITestInvoker* invoker, SourceLineInfo const& lineInfo, StringRef const& classOrMethod, NameAndTags const& nameAndTags ) noexcept {
        CATCH_TRY {
            getMutableRegistryHub()
                    .registerTest(
                        makeTestCase(
                            invoker,
                            extractClassName( classOrMethod ),
                            nameAndTags,
                            lineInfo));
        }